

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O1

void __thiscall
embree::Texture::Texture(Texture *this,uint width,uint height,Format format,char *in)

{
  ulong uVar1;
  uint uVar2;
  void *__s;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = (ulong)width;
  this->width = width;
  this->height = height;
  this->format = format;
  uVar2 = getFormatBytesPerTexel(format);
  this->bytesPerTexel = uVar2;
  this->width_mask = 0;
  this->height_mask = 0;
  this->data = (void *)0x0;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  do {
    uVar5 = (uint)uVar3;
    if (uVar5 < 2) break;
    uVar1 = uVar3 & 1;
    uVar3 = uVar3 >> 1;
  } while (uVar1 == 0);
  uVar6 = 0;
  if (uVar5 == 1) {
    uVar6 = width - 1;
  }
  this->width_mask = uVar6;
  uVar5 = height;
  do {
    uVar6 = uVar5;
    if (uVar6 < 2) break;
    uVar5 = uVar6 >> 1;
  } while ((uVar6 & 1) == 0);
  uVar5 = 0;
  if (uVar6 == 1) {
    uVar5 = height - 1;
  }
  this->height_mask = uVar5;
  iVar4 = width * height;
  __s = alignedUSMMalloc((ulong)(uVar2 * iVar4),0x10,DEVICE_READ_ONLY);
  this->data = __s;
  if (in != (char *)0x0) {
    if (this->bytesPerTexel * iVar4 != 0) {
      uVar3 = 0;
      do {
        *(char *)((long)this->data + uVar3) = in[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->bytesPerTexel * iVar4);
    }
    return;
  }
  memset(__s,0,(ulong)(iVar4 * this->bytesPerTexel));
  return;
}

Assistant:

Texture::Texture (unsigned width, unsigned height, const Format format, const char* in)
    : width(width), height(height), format(format), bytesPerTexel(getFormatBytesPerTexel(format)), width_mask(0), height_mask(0), data(nullptr)
  {
    width_mask  = isPowerOf2(width) ? width-1 : 0;
    height_mask = isPowerOf2(height) ? height-1 : 0;

    data = alignedUSMMalloc(bytesPerTexel*width*height,16);
    if (in) {
      for (size_t i=0; i<bytesPerTexel*width*height; i++)
	((char*)data)[i] = in[i];
    }
    else {
      memset(data,0 ,bytesPerTexel*width*height);
    }   
  }